

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O2

string * __thiscall
cmFindProgramCommand::FindAppBundle_abi_cxx11_
          (string *__return_storage_ptr__,cmFindProgramCommand *this)

{
  pointer pbVar1;
  pointer __lhs;
  string executable;
  string appPath;
  string appName;
  
  pbVar1 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__lhs = (this->super_cmFindBase).Names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __lhs != pbVar1; __lhs = __lhs + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&appPath,".app",(allocator<char> *)&executable);
    std::operator+(&appName,__lhs,&appPath);
    std::__cxx11::string::~string((string *)&appPath);
    cmsys::SystemTools::FindDirectory
              (&appPath,&appName,&(this->super_cmFindBase).super_cmFindCommon.SearchPaths,true);
    if (appPath._M_string_length != 0) {
      executable._M_dataplus._M_p = (pointer)&executable.field_2;
      executable._M_string_length = 0;
      executable.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::~string((string *)&executable);
    }
    std::__cxx11::string::~string((string *)&appPath);
    std::__cxx11::string::~string((string *)&appName);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&appName);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindProgramCommand::FindAppBundle()
{
  for (std::string const& name : this->Names) {

    std::string appName = name + std::string(".app");
    std::string appPath =
      cmSystemTools::FindDirectory(appName, this->SearchPaths, true);

    if (!appPath.empty()) {
      std::string executable = this->GetBundleExecutable(appPath);
      if (!executable.empty()) {
        return cmSystemTools::CollapseFullPath(executable);
      }
    }
  }

  // Couldn't find app bundle
  return "";
}